

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  thread logicThread;
  Timer timy;
  Timer timx;
  App app;
  MySimulator sim;
  thread local_208;
  App *local_200;
  code *local_1f8;
  undefined8 local_1f0;
  code *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1dc;
  code *local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c4;
  App local_1b8;
  Simulator local_148;
  code **local_50;
  code **local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined2 local_28;
  undefined1 local_26;
  
  local_1c8 = 0;
  local_1c4 = 0;
  local_1d0 = timxCallback;
  local_1e0 = 0;
  local_1dc = 0;
  local_1e8 = timyCallback;
  brown::Simulator::Simulator(&local_148);
  local_148._vptr_Simulator = (_func_int **)&PTR_hardwareLoop_0010ad88;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  local_28 = 0x101;
  local_26 = 0;
  local_50 = &local_1d0;
  local_48 = &local_1e8;
  brown::App::App(&local_1b8,&local_148,userInit,userLoop);
  local_1f8 = brown::App::runLogic;
  local_1f0 = 0;
  local_200 = &local_1b8;
  std::thread::thread<int(brown::App::*)(),brown::App*,void>
            (&local_208,(offset_in_App_to_subr *)&local_1f8,&local_200);
  iVar1 = brown::App::runGraphics(&local_1b8);
  std::thread::join();
  if (local_208._M_id._M_thread == 0) {
    brown::App::~App(&local_1b8);
    brown::Simulator::~Simulator(&local_148);
    return iVar1;
  }
  std::terminate();
}

Assistant:

int main(int argc, const char * argv[]) {
    brown::Timer timx(timxCallback);
    brown::Timer timy(timyCallback);
    brown::MySimulator sim(timx, timy);
    brown::App app(sim, userInit, userLoop);
    std::thread logicThread(&brown::App::runLogic, &app);
    int retCode = app.runGraphics();
    logicThread.join();
    return retCode;
}